

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars,
          bool writeZeroObjective)

{
  Item *pIVar1;
  uint *puVar2;
  cpp_dec_float<50U,_int,_void> *v;
  bool bVar3;
  pointer pnVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxOut *pSVar6;
  Real a;
  char cVar7;
  undefined8 uVar8;
  NameSet *pNVar9;
  int iVar10;
  int iVar11;
  ulong *puVar12;
  char *pcVar13;
  char *pcVar14;
  char *name2_00;
  undefined8 uVar15;
  double *pdVar16;
  undefined8 *puVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  undefined7 uVar22;
  char cVar23;
  ulong uVar24;
  pointer pnVar25;
  char *pcVar26;
  cpp_dec_float<50U,_int,_void> *v_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *value1;
  cpp_dec_float<50u,int,void> *pcVar27;
  undefined7 in_register_00000089;
  long lVar28;
  long lVar29;
  uint uVar30;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  char name1 [16];
  char name [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  char name2 [16];
  cpp_dec_float<50u,int,void> *pcVar31;
  fpclass_type local_a08;
  cpp_dec_float<50U,_int,_void> local_9e8;
  double local_9a8;
  undefined8 uStack_9a0;
  cpp_dec_float<50U,_int,_void> local_998;
  uint local_954;
  ulong local_950;
  NameSet *local_948;
  undefined8 uStack_940;
  char local_938 [16];
  char *local_928;
  undefined8 uStack_920;
  IdxSet *local_910;
  undefined4 local_904;
  uint local_900;
  undefined4 local_8fc;
  char local_8f8 [24];
  double local_8e0;
  cpp_dec_float<50U,_int,_void> local_8d8;
  cpp_dec_float<50U,_int,_void> local_898;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_860;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  uint local_7e8 [2];
  uint auStack_7e0 [2];
  uint local_7d8 [2];
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined4 local_790;
  undefined1 local_78c;
  undefined8 local_788;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined4 local_750;
  undefined1 local_74c;
  undefined8 local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined4 local_710;
  undefined1 local_70c;
  undefined8 local_708;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0;
  undefined1 local_6cc;
  undefined8 local_6c8;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined4 local_690;
  undefined1 local_68c;
  undefined8 local_688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  cpp_dec_float<50u,int,void> local_638 [8];
  uint auStack_630 [2];
  uint local_628 [2];
  undefined8 uStack_620;
  undefined8 local_618;
  int local_610;
  byte local_60c;
  fpclass_type local_608;
  int32_t iStack_604;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b8;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined4 local_550;
  undefined1 local_54c;
  undefined8 local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  char local_438 [16];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined5 uStack_410;
  undefined3 local_40b;
  undefined5 uStack_408;
  undefined8 uStack_403;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined5 uStack_3d0;
  undefined3 local_3cb;
  undefined5 uStack_3c8;
  undefined8 uStack_3c3;
  undefined8 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined5 uStack_390;
  undefined3 uStack_38b;
  undefined5 uStack_388;
  undefined8 uStack_383;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined5 uStack_350;
  undefined3 uStack_34b;
  undefined5 uStack_348;
  undefined8 uStack_343;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined5 uStack_310;
  undefined3 local_30b;
  undefined5 uStack_308;
  undefined8 uStack_303;
  undefined8 local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined5 uStack_2d0;
  undefined3 uStack_2cb;
  undefined5 uStack_2c8;
  undefined8 uStack_2c3;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined5 uStack_290;
  undefined3 uStack_28b;
  undefined5 uStack_288;
  undefined8 uStack_283;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined5 uStack_250;
  undefined3 local_24b;
  undefined5 uStack_248;
  undefined8 uStack_243;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined5 uStack_210;
  undefined3 uStack_20b;
  undefined5 uStack_208;
  undefined8 uStack_203;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined5 uStack_1d0;
  undefined3 uStack_1cb;
  undefined5 uStack_1c8;
  undefined8 uStack_1c3;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 uStack_188;
  undefined8 uStack_183;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined5 uStack_150;
  undefined3 local_14b;
  undefined5 uStack_148;
  undefined8 uStack_143;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined5 uStack_110;
  undefined3 uStack_10b;
  undefined5 uStack_108;
  undefined8 uStack_103;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 uStack_c8;
  undefined8 uStack_c3;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 uStack_48;
  undefined8 uStack_43;
  undefined8 local_38;
  
  local_8fc = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  lVar28 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar28 + -0x18) + 8) = 0x10;
  lVar28 = *(long *)(lVar28 + -0x18);
  *(uint *)(p_output + lVar28 + 0x18) = *(uint *)(p_output + lVar28 + 0x18) & 0xfffffefb | 0x100;
  local_948 = p_rnames;
  local_910 = &p_intvars->super_IdxSet;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"NAME          MPSDATA",0x15);
  cVar7 = (char)p_output;
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ROWS",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    local_954 = 0;
  }
  else {
    puVar12 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_928 = (char *)*puVar12;
    uStack_920 = 0;
    local_9a8 = -(double)local_928;
    uStack_9a0 = 0x8000000000000000;
    lVar29 = 0;
    lVar28 = 0;
    local_954 = 0;
    do {
      pnVar25 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) ||
         (pnVar4 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar29 + 8U) == 2)) {
LAB_00247bc8:
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_9a8);
        if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
           0 < iVar10)) {
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_998.fpclass = cpp_dec_float_finite;
          local_998.prec_elem = 10;
          local_998.data._M_elems[0] = 0;
          local_998.data._M_elems[1] = 0;
          local_998.data._M_elems[2] = 0;
          local_998.data._M_elems[3] = 0;
          local_998.data._M_elems[4] = 0;
          local_998.data._M_elems[5] = 0;
          local_998.data._M_elems._24_5_ = 0;
          local_998.data._M_elems[7]._1_3_ = 0;
          local_998.data._M_elems._32_5_ = 0;
          local_998.data._M_elems[9]._1_3_ = 0;
          local_998.exp = 0;
          local_998.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_998,(double)local_928);
          if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
              (local_998.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_998),
             iVar10 < 0)) {
            local_954 = (uint)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
            goto LAB_00247db2;
          }
        }
        pnVar25 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_9a8);
        if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) ||
            (local_9e8.fpclass == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
           iVar10 < 1)) {
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_928);
          if ((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) ||
             (local_9e8.fpclass == cpp_dec_float_NaN)) {
LAB_0024986f:
            puVar17 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_9e8.data._M_elems._0_8_ = (undefined1 *)((long)&local_9e8 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_9e8,"XMPSWR02 This should never happen.","");
            *puVar17 = &PTR__SPxException_003adbd8;
            puVar17[1] = puVar17 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar17 + 1),local_9e8.data._M_elems._0_8_,
                       (undefined1 *)(local_9e8.data._M_elems._0_8_ + local_9e8.data._M_elems._8_8_)
                      );
            *puVar17 = &PTR__SPxException_003ae9a0;
            __cxa_throw(puVar17,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8);
          pcVar26 = "L";
          if (-1 < iVar10) goto LAB_0024986f;
        }
        else {
          pcVar26 = "G";
        }
      }
      else {
        iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)
                            ((long)(pnVar25->m_backend).data._M_elems + lVar29),
                            (cpp_dec_float<50U,_int,_void> *)
                            ((long)(pnVar4->m_backend).data._M_elems + lVar29));
        if (iVar10 != 0) {
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00247bc8;
        }
LAB_00247db2:
        pcVar26 = "E";
      }
      pcVar13 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)(this->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thekey,(int)lVar28,local_948,local_8f8);
      local_b8 = 0xa00000000;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      uStack_cb = 0;
      uStack_c8 = 0;
      uStack_c3 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_e8,0.0);
      local_f8 = 0xa00000000;
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      uStack_110 = 0;
      uStack_10b = 0;
      uStack_108 = 0;
      uStack_103 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
      MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (p_output,pcVar26,pcVar13,(char *)0x0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_e8,(char *)0x0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_128);
      lVar28 = lVar28 + 1;
      lVar29 = lVar29 + 0x38;
    } while (lVar28 < (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_38 = 0xa00000000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  uStack_48 = 0;
  uStack_43 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  uStack_88 = 0;
  uStack_83 = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
  uVar24 = 0;
  MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (p_output,"N","MINIMIZE",(char *)0x0,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_68,(char *)0x0,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_a8);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"COLUMNS",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (local_910 != (IdxSet *)0x0) {
    uVar24 = (ulong)(0 < local_910->num);
  }
  uVar15 = CONCAT71((int7)((ulong)local_910 >> 8),1);
  bVar18 = 0;
  uVar22 = 0;
  local_950 = uVar24;
  do {
    local_904 = (undefined4)uVar15;
    bVar18 = bVar18 & (byte)uVar24;
    dVar21 = (double)CONCAT71(uVar22,bVar18);
    local_8e0 = dVar21;
    if (bVar18 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTORG\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    if (0 < (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      dVar21 = 0.0;
      do {
        local_9a8 = dVar21;
        if ((char)uVar24 == '\0') {
LAB_0024802b:
          pIVar1 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem +
                   (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thekey[(long)local_9a8].idx;
          uVar30 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          uVar19 = uVar30 - ((int)uVar30 >> 0x1f) & 0xfffffffe;
          if ((int)uVar30 < 2) {
            pcVar26 = (char *)0x0;
          }
          else {
            local_928 = (char *)(ulong)uVar19;
            lVar28 = 0;
            pcVar26 = (char *)0x0;
            local_900 = uVar19;
            do {
              pcVar13 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(this->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .set.thekey,SUB84(local_9a8,0),p_cnames,local_8f8);
              pNVar9 = local_948;
              pcVar14 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(this->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .set.thekey,
                                   *(int *)((long)(&((pIVar1->data).
                                                                                                          
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar28),local_948,local_938);
              pNVar5 = (pIVar1->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar28);
              local_478.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)(pNVar5->val).m_backend.data._M_elems + lVar28 + 0x10);
              local_478.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_478.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)(pNVar5->val).m_backend.data._M_elems + lVar28 + 0x20);
              local_478.m_backend.exp = *(int *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar28)
              ;
              local_478.m_backend.neg =
                   *(bool *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar28 + 4);
              local_478.m_backend._48_8_ =
                   *(undefined8 *)((long)(&(pNVar5->val).m_backend.data + 1) + lVar28 + 8);
              name2_00 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                   ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)(this->
                                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).
                                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .set.thekey,
                                    *(int *)((long)(&(pIVar1->data).
                                                                                                          
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem[1].val + 1) + lVar28),pNVar9,local_438);
              pNVar5 = (pIVar1->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              puVar2 = (uint *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar28);
              local_4b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_4b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar28 + 0x10);
              local_4b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_4b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_4b8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)pNVar5[1].val.m_backend.data._M_elems + lVar28 + 0x20);
              local_4b8.m_backend.exp = *(int *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar28)
              ;
              local_4b8.m_backend.neg =
                   *(bool *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar28 + 4);
              local_4b8.m_backend._48_8_ =
                   *(undefined8 *)((long)(&pNVar5[1].val.m_backend.data + 1) + lVar28 + 8);
              MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (p_output,(char *)0x0,pcVar13,pcVar14,&local_478,name2_00,&local_4b8);
              pcVar26 = pcVar26 + 2;
              lVar28 = lVar28 + 0x78;
            } while (pcVar26 < local_928);
            uVar30 = (pIVar1->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            uVar19 = local_900;
          }
          if (uVar19 != uVar30) {
            pcVar13 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)(this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey,SUB84(local_9a8,0),p_cnames,local_8f8);
            pcVar14 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)(this->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey,
                                 (pIVar1->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[(long)pcVar26].idx,local_948,local_938);
            pNVar5 = (pIVar1->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_4f8.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&pNVar5[(long)pcVar26].val.m_backend.data;
            local_4f8.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pNVar5[(long)pcVar26].val.m_backend.data._M_elems + 2);
            puVar2 = pNVar5[(long)pcVar26].val.m_backend.data._M_elems + 4;
            local_4f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_4f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_4f8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(pNVar5[(long)pcVar26].val.m_backend.data._M_elems + 8);
            local_4f8.m_backend.exp = pNVar5[(long)pcVar26].val.m_backend.exp;
            local_4f8.m_backend.neg = pNVar5[(long)pcVar26].val.m_backend.neg;
            local_4f8.m_backend.fpclass = pNVar5[(long)pcVar26].val.m_backend.fpclass;
            local_4f8.m_backend.prec_elem = pNVar5[(long)pcVar26].val.m_backend.prec_elem;
            local_138 = 0xa00000000;
            uStack_148 = 0;
            uStack_143 = 0;
            uStack_158 = 0;
            uStack_150 = 0;
            local_14b = 0;
            local_168 = 0;
            uStack_160 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,(char *)0x0,pcVar13,pcVar14,&local_4f8,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_168);
          }
          dVar21 = local_9a8;
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).object.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_7c8 = *(undefined8 *)(pnVar25[(long)local_9a8].m_backend.data._M_elems + 8);
          local_7e8 = pnVar25[(long)local_9a8].m_backend.data._M_elems[0];
          auStack_7e0 = *(uint (*) [2])(pnVar25[(long)local_9a8].m_backend.data._M_elems + 2);
          puVar2 = pnVar25[(long)local_9a8].m_backend.data._M_elems + 4;
          local_7d8 = *(uint (*) [2])puVar2;
          uStack_7d0 = *(undefined8 *)(puVar2 + 2);
          iVar10 = pnVar25[(long)local_9a8].m_backend.exp;
          bVar3 = pnVar25[(long)local_9a8].m_backend.neg;
          uVar15._0_4_ = pnVar25[(long)local_9a8].m_backend.fpclass;
          uVar15._4_4_ = pnVar25[(long)local_9a8].m_backend.prec_elem;
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a = Tolerances::epsilon(this_00);
          local_998.data._M_elems._32_5_ = SUB85(local_7c8,0);
          local_998.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_7c8 >> 0x28);
          local_998.data._M_elems[4] = local_7d8[0];
          local_998.data._M_elems[5] = local_7d8[1];
          local_998.data._M_elems._24_5_ = SUB85(uStack_7d0,0);
          local_998.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_7d0 >> 0x28);
          local_998.data._M_elems[0] = local_7e8[0];
          local_998.data._M_elems[1] = local_7e8[1];
          uVar8 = local_998.data._M_elems._0_8_;
          local_998.data._M_elems[2] = auStack_7e0[0];
          local_998.data._M_elems[3] = auStack_7e0[1];
          local_998.neg = bVar3;
          if ((bVar3 != false) &&
             (local_998.data._M_elems[0] = local_7e8[0],
             local_998.data._M_elems[0] != 0 || (fpclass_type)uVar15 != cpp_dec_float_finite)) {
            local_998.neg = (bool)(bVar3 ^ 1);
          }
          bVar3 = false;
          local_998.data._M_elems._0_8_ = uVar8;
          local_998.exp = iVar10;
          local_998._48_8_ = uVar15;
          if (((fpclass_type)uVar15 != cpp_dec_float_NaN) && (!NAN(a))) {
            local_9e8.fpclass = cpp_dec_float_finite;
            local_9e8.prec_elem = 10;
            local_9e8.data._M_elems[0] = 0;
            local_9e8.data._M_elems[1] = 0;
            local_9e8.data._M_elems[2] = 0;
            local_9e8.data._M_elems[3] = 0;
            local_9e8.data._M_elems[4] = 0;
            local_9e8.data._M_elems[5] = 0;
            local_9e8.data._M_elems._24_5_ = 0;
            local_9e8.data._M_elems[7]._1_3_ = 0;
            local_9e8.data._M_elems._32_5_ = 0;
            local_9e8._37_8_ = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_9e8,a);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_998,&local_9e8);
            bVar3 = 0 < iVar10;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          uVar24 = local_950;
          if (bVar3 || (char)local_8fc != '\0') {
            pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)(this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey,SUB84(local_9a8,0),p_cnames,local_8f8);
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).object.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_828.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)&pnVar25[(long)dVar21].m_backend.data;
            local_828.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar25[(long)dVar21].m_backend.data._M_elems + 2);
            puVar2 = pnVar25[(long)dVar21].m_backend.data._M_elems + 4;
            local_828.m_backend.data._M_elems[4] = *puVar2;
            local_828.m_backend.data._M_elems[5] = puVar2[1];
            local_828.m_backend.data._M_elems[6] = puVar2[2];
            local_828.m_backend.data._M_elems[7] = puVar2[3];
            local_828.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)(pnVar25[(long)dVar21].m_backend.data._M_elems + 8);
            local_828.m_backend.exp = pnVar25[(long)dVar21].m_backend.exp;
            local_828.m_backend.neg = pnVar25[(long)dVar21].m_backend.neg;
            local_828.m_backend.fpclass = pnVar25[(long)dVar21].m_backend.fpclass;
            local_828.m_backend.prec_elem = pnVar25[(long)dVar21].m_backend.prec_elem;
            if (local_828.m_backend.fpclass != cpp_dec_float_finite ||
                local_828.m_backend.data._M_elems[0] != 0) {
              local_828.m_backend.neg = (bool)(local_828.m_backend.neg ^ 1);
            }
            local_178 = 0xa00000000;
            local_1a8 = 0;
            uStack_1a0 = 0;
            local_198 = 0;
            uStack_190 = 0;
            uStack_18b = 0;
            uStack_188 = 0;
            uStack_183 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_1a8,0.0);
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,(char *)0x0,pcVar26,"MINIMIZE",&local_828,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1a8);
          }
        }
        else {
          iVar10 = IdxSet::pos(local_910,SUB84(dVar21,0));
          if (-1 < iVar10 == (bool)local_8e0._0_1_) goto LAB_0024802b;
        }
        dVar21 = (double)((long)local_9a8 + 1);
      } while ((long)dVar21 <
               (long)(this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
    }
    if (local_8e0._0_1_ != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTEND\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
      break;
    }
    uVar22 = (undefined7)((ulong)dVar21 >> 8);
    bVar18 = 1;
    uVar15 = 0;
  } while (((byte)local_904 & (byte)uVar24) != 0);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"RHS",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (0 < (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    uVar24 = 0;
    do {
      local_998.fpclass = cpp_dec_float_finite;
      local_998.prec_elem = 10;
      local_998.data._M_elems[0] = 0;
      local_998.data._M_elems[1] = 0;
      local_998.data._M_elems[2] = 0;
      local_998.data._M_elems[3] = 0;
      local_998.data._M_elems[4] = 0;
      local_998.data._M_elems[5] = 0;
      local_998.data._M_elems._24_5_ = 0;
      local_998.data._M_elems[7]._1_3_ = 0;
      local_998.data._M_elems._32_5_ = 0;
      local_998.data._M_elems[9]._1_3_ = 0;
      local_998.exp = 0;
      local_998.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_998,0.0);
      local_8d8.fpclass = cpp_dec_float_finite;
      local_8d8.prec_elem = 10;
      local_8d8.data._M_elems[0] = 0;
      local_8d8.data._M_elems[1] = 0;
      local_8d8.data._M_elems[2] = 0;
      local_8d8.data._M_elems[3] = 0;
      local_8d8.data._M_elems[4] = 0;
      local_8d8.data._M_elems[5] = 0;
      local_8d8.data._M_elems._24_5_ = 0;
      local_8d8.data._M_elems[7]._1_3_ = 0;
      local_8d8.data._M_elems._32_5_ = 0;
      local_8d8.data._M_elems[9]._1_3_ = 0;
      local_8d8.exp = 0;
      local_8d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_8d8,0.0);
      if ((int)uVar24 <
          (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        uVar24 = (ulong)(int)uVar24;
        lVar28 = uVar24 * 0x38 + 0x30;
        do {
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_798 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x10);
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x30);
          local_7b8 = *puVar17;
          uStack_7b0 = puVar17[1];
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x20);
          local_7a8 = *puVar17;
          uStack_7a0 = puVar17[1];
          local_790 = *(undefined4 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -8);
          local_78c = *(undefined1 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -4);
          local_788 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28);
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_538.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x10);
          puVar2 = (uint *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x30);
          local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_538.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -0x20);
          local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_538.m_backend.exp = *(int *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -8)
          ;
          local_538.m_backend.neg =
               *(bool *)((long)(pnVar25->m_backend).data._M_elems + lVar28 + -4);
          local_538.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar28);
          MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_860,(soplex *)&local_7b8,&local_538,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_538.m_backend.exp >> 8),
                                        local_538.m_backend.neg));
          local_998.data._M_elems._32_5_ = local_860.m_backend.data._M_elems._32_5_;
          local_998.data._M_elems[9]._1_3_ = local_860.m_backend.data._M_elems[9]._1_3_;
          local_998.data._M_elems[4] = local_860.m_backend.data._M_elems[4];
          local_998.data._M_elems[5] = local_860.m_backend.data._M_elems[5];
          local_998.data._M_elems._24_5_ = local_860.m_backend.data._M_elems._24_5_;
          local_998.data._M_elems[7]._1_3_ = local_860.m_backend.data._M_elems[7]._1_3_;
          local_998.data._M_elems[0] = local_860.m_backend.data._M_elems[0];
          local_998.data._M_elems[1] = local_860.m_backend.data._M_elems[1];
          local_998.data._M_elems[2] = local_860.m_backend.data._M_elems[2];
          local_998.data._M_elems[3] = local_860.m_backend.data._M_elems[3];
          local_998.exp = local_860.m_backend.exp;
          local_998.neg = local_860.m_backend.neg;
          local_998.fpclass = local_860.m_backend.fpclass;
          local_998.prec_elem = local_860.m_backend.prec_elem;
          if (local_860.m_backend.fpclass == cpp_dec_float_NaN) break;
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_998,&local_9e8);
          if (iVar10 != 0) break;
          uVar24 = uVar24 + 1;
          lVar28 = lVar28 + 0x38;
        } while ((long)uVar24 <
                 (long)(this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.thenum);
      }
      iVar10 = (this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      uVar30 = (uint)uVar24;
      if ((int)uVar30 < iVar10) {
        lVar28 = (long)(int)uVar30;
        lVar29 = lVar28 * 0x38 + 0x68;
        uVar19 = uVar30 + 2;
        do {
          uVar20 = uVar19;
          lVar28 = lVar28 + 1;
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= lVar28) break;
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_558 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x10);
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x30);
          local_578 = *puVar17;
          uStack_570 = puVar17[1];
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x20);
          local_568 = *puVar17;
          uStack_560 = puVar17[1];
          local_550 = *(undefined4 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -8);
          local_54c = *(undefined1 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -4);
          local_548 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_5b8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x10);
          puVar2 = (uint *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x30);
          local_5b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_5b8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -0x20);
          local_5b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_5b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_5b8.m_backend.exp = *(int *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -8)
          ;
          local_5b8.m_backend.neg =
               *(bool *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + -4);
          local_5b8.m_backend._48_8_ =
               *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
          MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_860,(soplex *)&local_578,&local_5b8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)local_5b8.m_backend.exp >> 8),
                                        local_5b8.m_backend.neg));
          local_8d8.data._M_elems._32_5_ = local_860.m_backend.data._M_elems._32_5_;
          local_8d8.data._M_elems[9]._1_3_ = local_860.m_backend.data._M_elems[9]._1_3_;
          local_8d8.data._M_elems[4] = local_860.m_backend.data._M_elems[4];
          local_8d8.data._M_elems[5] = local_860.m_backend.data._M_elems[5];
          local_8d8.data._M_elems._24_5_ = local_860.m_backend.data._M_elems._24_5_;
          local_8d8.data._M_elems[7]._1_3_ = local_860.m_backend.data._M_elems[7]._1_3_;
          local_8d8.data._M_elems[0] = local_860.m_backend.data._M_elems[0];
          local_8d8.data._M_elems[1] = local_860.m_backend.data._M_elems[1];
          local_8d8.data._M_elems[2] = local_860.m_backend.data._M_elems[2];
          local_8d8.data._M_elems[3] = local_860.m_backend.data._M_elems[3];
          local_8d8.exp = local_860.m_backend.exp;
          local_8d8.neg = local_860.m_backend.neg;
          local_8d8.fpclass = local_860.m_backend.fpclass;
          local_8d8.prec_elem = local_860.m_backend.prec_elem;
          if (local_860.m_backend.fpclass == cpp_dec_float_NaN) break;
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_8d8,&local_9e8);
          lVar29 = lVar29 + 0x38;
          uVar19 = uVar20 + 1;
        } while (iVar10 == 0);
        pNVar9 = local_948;
        iVar10 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        pcVar26 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)(this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thekey,uVar30,local_948,local_938);
        if ((int)(uVar20 - 1) < iVar10) {
          local_5f8.m_backend.data._M_elems[9]._1_3_ = local_998.data._M_elems[9]._1_3_;
          local_5f8.m_backend.data._M_elems._32_5_ = local_998.data._M_elems._32_5_;
          local_5f8.m_backend.data._M_elems[7]._1_3_ = local_998.data._M_elems[7]._1_3_;
          local_5f8.m_backend.data._M_elems._24_5_ = local_998.data._M_elems._24_5_;
          local_5f8.m_backend.data._M_elems[4] = local_998.data._M_elems[4];
          local_5f8.m_backend.data._M_elems[5] = local_998.data._M_elems[5];
          local_5f8.m_backend.data._M_elems[0] = local_998.data._M_elems[0];
          local_5f8.m_backend.data._M_elems[1] = local_998.data._M_elems[1];
          local_5f8.m_backend.data._M_elems[2] = local_998.data._M_elems[2];
          local_5f8.m_backend.data._M_elems[3] = local_998.data._M_elems[3];
          local_5f8.m_backend.exp = local_998.exp;
          local_5f8.m_backend.neg = local_998.neg;
          local_5f8.m_backend.fpclass = local_998.fpclass;
          local_5f8.m_backend.prec_elem = local_998.prec_elem;
          pcVar13 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)(this->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thekey,uVar20 - 1,pNVar9,local_438);
          uStack_620 = CONCAT35(local_8d8.data._M_elems[7]._1_3_,local_8d8.data._M_elems._24_5_);
          local_638 = (cpp_dec_float<50u,int,void>  [8])local_8d8.data._M_elems._0_8_;
          auStack_630[0] = local_8d8.data._M_elems[2];
          auStack_630[1] = local_8d8.data._M_elems[3];
          local_628[0] = local_8d8.data._M_elems[4];
          local_628[1] = local_8d8.data._M_elems[5];
          local_618 = CONCAT35(local_8d8.data._M_elems[9]._1_3_,local_8d8.data._M_elems._32_5_);
          local_610 = local_8d8.exp;
          local_60c = local_8d8.neg;
          local_608 = local_8d8.fpclass;
          iStack_604 = local_8d8.prec_elem;
          pcVar31 = local_638;
          value1 = &local_5f8;
        }
        else {
          local_678.m_backend.data._M_elems[9]._1_3_ = local_998.data._M_elems[9]._1_3_;
          local_678.m_backend.data._M_elems._32_5_ = local_998.data._M_elems._32_5_;
          local_678.m_backend.data._M_elems[7]._1_3_ = local_998.data._M_elems[7]._1_3_;
          local_678.m_backend.data._M_elems._24_5_ = local_998.data._M_elems._24_5_;
          local_678.m_backend.data._M_elems[4] = local_998.data._M_elems[4];
          local_678.m_backend.data._M_elems[5] = local_998.data._M_elems[5];
          local_678.m_backend.data._M_elems[0] = local_998.data._M_elems[0];
          local_678.m_backend.data._M_elems[1] = local_998.data._M_elems[1];
          local_678.m_backend.data._M_elems[2] = local_998.data._M_elems[2];
          local_678.m_backend.data._M_elems[3] = local_998.data._M_elems[3];
          local_678.m_backend.exp = local_998.exp;
          local_678.m_backend.neg = local_998.neg;
          local_678.m_backend.fpclass = local_998.fpclass;
          local_678.m_backend.prec_elem = local_998.prec_elem;
          local_1b8 = 0xa00000000;
          local_1e8 = 0;
          uStack_1e0 = 0;
          local_1d8 = 0;
          uStack_1d0 = 0;
          uStack_1cb = 0;
          uStack_1c8 = 0;
          uStack_1c3 = 0;
          pcVar31 = (cpp_dec_float<50u,int,void> *)&local_1e8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
          value1 = &local_678;
          pcVar13 = (char *)0x0;
        }
        MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (p_output,(char *)0x0,"RHS",pcVar26,value1,pcVar13,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar31);
        iVar10 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        uVar30 = uVar20;
      }
      uVar24 = (ulong)uVar30;
    } while ((int)uVar30 < iVar10);
  }
  if ((local_954 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"RANGES",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    if (0 < (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      pdVar16 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_9a8 = *pdVar16;
      uStack_9a0 = 0;
      dVar21 = -local_9a8;
      lVar29 = 0;
      lVar28 = 0;
      do {
        pnVar25 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,dVar21);
        if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
           0 < iVar10)) {
          pnVar25 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_998.fpclass = cpp_dec_float_finite;
          local_998.prec_elem = 10;
          local_998.data._M_elems[0] = 0;
          local_998.data._M_elems[1] = 0;
          local_998.data._M_elems[2] = 0;
          local_998.data._M_elems[3] = 0;
          local_998.data._M_elems[4] = 0;
          local_998.data._M_elems[5] = 0;
          local_998.data._M_elems._24_5_ = 0;
          local_998.data._M_elems[7]._1_3_ = 0;
          local_998.data._M_elems._32_5_ = 0;
          local_998.data._M_elems[9]._1_3_ = 0;
          local_998.exp = 0;
          local_998.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_998,local_9a8);
          if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
              (local_998.fpclass != cpp_dec_float_NaN)) &&
             (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_998),
             iVar10 < 0)) {
            local_928 = MPSgetRowName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(this->
                                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .set.thekey,(int)lVar28,local_948,local_938);
            pnVar25 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            v = (cpp_dec_float<50U,_int,_void> *)((long)(pnVar25->m_backend).data._M_elems + lVar29)
            ;
            v_00 = (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar29);
            local_898.fpclass = cpp_dec_float_finite;
            local_898.prec_elem = 10;
            local_898.data._M_elems[0] = 0;
            local_898.data._M_elems[1] = 0;
            local_898.data._M_elems[2] = 0;
            local_898.data._M_elems[3] = 0;
            local_898.data._M_elems[4] = 0;
            local_898.data._M_elems[5] = 0;
            local_898.data._M_elems._24_5_ = 0;
            local_898.data._M_elems[7]._1_3_ = 0;
            local_898.data._M_elems._32_5_ = 0;
            local_898.data._M_elems[9]._1_3_ = 0;
            local_898.exp = 0;
            local_898.neg = false;
            if (v_00 == &local_898) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_898,v);
              if (local_898.data._M_elems[0] != 0 || local_898.fpclass != cpp_dec_float_finite) {
                local_898.neg = (bool)(local_898.neg ^ 1);
              }
            }
            else {
              if (v != &local_898) {
                uVar15 = *(undefined8 *)((v->data)._M_elems + 8);
                local_898.data._M_elems._32_5_ = SUB85(uVar15,0);
                local_898.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                local_898.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
                local_898.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
                local_898.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
                uVar15 = *(undefined8 *)((v->data)._M_elems + 6);
                local_898.data._M_elems._24_5_ = SUB85(uVar15,0);
                local_898.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                local_898.exp = *(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29);
                local_898.neg = *(bool *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 4U);
                local_898._48_8_ =
                     *(undefined8 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_898,v_00);
            }
            local_1f8 = 0xa00000000;
            local_228 = 0;
            uStack_220 = 0;
            local_218 = 0;
            uStack_210 = 0;
            uStack_20b = 0;
            uStack_208 = 0;
            uStack_203 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_228,0.0);
            MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (p_output,"","RANGE",local_928,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_898,(char *)0x0,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_228);
          }
        }
        lVar28 = lVar28 + 1;
        lVar29 = lVar29 + 0x38;
      } while (lVar28 < (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"BOUNDS",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (0 < (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    puVar12 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_948 = (NameSet *)*puVar12;
    uStack_940 = 0;
    local_9a8 = -(double)local_948;
    uStack_9a0 = 0x8000000000000000;
    lVar29 = 0;
    lVar28 = 0;
    do {
      pnVar25 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar10 = (int)lVar28;
      if ((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) ||
         (pnVar4 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)(&(pnVar4->m_backend).data + 1) + lVar29 + 8U) == 2)) {
        cVar23 = (char)local_950;
LAB_00248fdc:
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,local_9a8);
        if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
           iVar11 < 1)) {
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_998.fpclass = cpp_dec_float_finite;
          local_998.prec_elem = 10;
          local_998.data._M_elems[0] = 0;
          local_998.data._M_elems[1] = 0;
          local_998.data._M_elems[2] = 0;
          local_998.data._M_elems[3] = 0;
          local_998.data._M_elems[4] = 0;
          local_998.data._M_elems[5] = 0;
          local_998.data._M_elems._24_5_ = 0;
          local_998.data._M_elems[7]._1_3_ = 0;
          local_998.data._M_elems._32_5_ = 0;
          local_998.data._M_elems[9]._1_3_ = 0;
          local_998.exp = 0;
          local_998.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_998,(double)local_948);
          if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
              (local_998.fpclass != cpp_dec_float_NaN)) &&
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_998),
             -1 < iVar11)) {
            local_928 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(this->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).
                                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .set.thekey,iVar10,p_cnames,local_938);
            local_278 = 0xa00000000;
            local_2a8 = 0;
            uStack_2a0 = 0;
            local_298 = 0;
            uStack_290 = 0;
            uStack_28b = 0;
            uStack_288 = 0;
            uStack_283 = 0;
            pcVar27 = (cpp_dec_float<50u,int,void> *)&local_2a8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar27,0.0);
            local_2b8 = 0xa00000000;
            local_2e8 = 0;
            uStack_2e0 = 0;
            local_2d8 = 0;
            uStack_2d0 = 0;
            uStack_2cb = 0;
            uStack_2c8 = 0;
            uStack_2c3 = 0;
            pcVar31 = (cpp_dec_float<50u,int,void> *)&local_2e8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
            pcVar13 = "FR";
            pcVar26 = local_928;
            goto LAB_00249793;
          }
        }
        pnVar25 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) {
LAB_002490aa:
          ::soplex::infinity::__tls_init();
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,local_9a8);
          if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) == 2) ||
              (local_9e8.fpclass == cpp_dec_float_NaN)) ||
             (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
             iVar11 < 1)) {
            pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)(this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey,iVar10,p_cnames,local_938);
            local_338 = 0xa00000000;
            local_368 = 0;
            uStack_360 = 0;
            local_358 = 0;
            uStack_350 = 0;
            uStack_34b = 0;
            uStack_348 = 0;
            uStack_343 = 0;
            pcVar27 = (cpp_dec_float<50u,int,void> *)&local_368;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar27,0.0);
            local_378 = 0xa00000000;
            local_3a8 = 0;
            uStack_3a0 = 0;
            local_398 = 0;
            uStack_390 = 0;
            uStack_38b = 0;
            uStack_388 = 0;
            uStack_383 = 0;
            pcVar31 = (cpp_dec_float<50u,int,void> *)&local_3a8;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
            pcVar13 = "MI";
          }
          else {
            pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)(this->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey,iVar10,p_cnames,local_938);
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
            local_6f8 = *puVar17;
            uStack_6f0 = puVar17[1];
            puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x10);
            local_6e8 = *puVar17;
            uStack_6e0 = puVar17[1];
            local_6d8 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x20);
            local_6d0 = *(undefined4 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29);
            local_6cc = *(undefined1 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 4U);
            local_6c8 = *(undefined8 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U);
            local_2f8 = 0xa00000000;
            uStack_308 = 0;
            uStack_303 = 0;
            uStack_318 = 0;
            uStack_310 = 0;
            local_30b = 0;
            local_328 = 0;
            uStack_320 = 0;
            pcVar31 = (cpp_dec_float<50u,int,void> *)&local_328;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
            pcVar13 = "LO";
            pcVar27 = (cpp_dec_float<50u,int,void> *)&local_6f8;
          }
          MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (p_output,pcVar13,"BOUND",pcVar26,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)pcVar27,(char *)0x0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)pcVar31);
          cVar23 = (char)local_950;
        }
        else {
          local_9e8.fpclass = cpp_dec_float_finite;
          local_9e8.prec_elem = 10;
          local_9e8.data._M_elems._0_16_ = ZEXT816(0);
          local_9e8.data._M_elems[4] = 0;
          local_9e8.data._M_elems[5] = 0;
          local_9e8.data._M_elems._24_5_ = 0;
          local_9e8.data._M_elems[7]._1_3_ = 0;
          local_9e8.data._M_elems._32_5_ = 0;
          local_9e8._37_8_ = 0;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_9e8,0.0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8);
          if (iVar11 != 0) {
            pnVar25 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_002490aa;
          }
        }
        if ((cVar23 != '\0') && (iVar11 = IdxSet::pos(local_910,iVar10), -1 < iVar11)) {
          pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)(this->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thekey,iVar10,p_cnames,local_938);
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
          local_738 = *puVar17;
          uStack_730 = puVar17[1];
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x10);
          local_728 = *puVar17;
          uStack_720 = puVar17[1];
          local_718 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x20);
          local_710 = *(undefined4 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29);
          local_70c = *(undefined1 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 4U);
          local_708 = *(undefined8 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U);
          local_3b8 = 0xa00000000;
          uStack_3c8 = 0;
          uStack_3c3 = 0;
          uStack_3d8 = 0;
          uStack_3d0 = 0;
          local_3cb = 0;
          local_3e8 = 0;
          uStack_3e0 = 0;
          pcVar31 = (cpp_dec_float<50u,int,void> *)&local_3e8;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
          pcVar13 = "UP";
          pcVar27 = (cpp_dec_float<50u,int,void> *)&local_738;
          goto LAB_00249793;
        }
        pnVar25 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_9e8.fpclass = cpp_dec_float_finite;
        local_9e8.prec_elem = 10;
        local_9e8.data._M_elems._0_16_ = ZEXT816(0);
        local_9e8.data._M_elems[4] = 0;
        local_9e8.data._M_elems[5] = 0;
        local_9e8.data._M_elems._24_5_ = 0;
        local_9e8.data._M_elems[7]._1_3_ = 0;
        local_9e8.data._M_elems._32_5_ = 0;
        local_9e8._37_8_ = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_9e8,(double)local_948);
        if (((*(int *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U) != 2) &&
            (local_9e8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)(pnVar25->m_backend).data._M_elems + lVar29),&local_9e8),
           iVar11 < 0)) {
          pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)(this->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.thekey,iVar10,p_cnames,local_938);
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
          local_778 = *puVar17;
          uStack_770 = puVar17[1];
          puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x10);
          local_768 = *puVar17;
          uStack_760 = puVar17[1];
          local_758 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x20);
          local_750 = *(undefined4 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29);
          local_74c = *(undefined1 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 4U);
          local_748 = *(undefined8 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U);
          local_3f8 = 0xa00000000;
          uStack_408 = 0;
          uStack_403 = 0;
          uStack_418 = 0;
          uStack_410 = 0;
          local_40b = 0;
          local_428 = 0;
          uStack_420 = 0;
          pcVar31 = (cpp_dec_float<50u,int,void> *)&local_428;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
          pcVar13 = "UP";
          pcVar27 = (cpp_dec_float<50u,int,void> *)&local_778;
          goto LAB_00249793;
        }
      }
      else {
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           ((cpp_dec_float<50U,_int,_void> *)
                            ((long)(pnVar25->m_backend).data._M_elems + lVar29),
                            (cpp_dec_float<50U,_int,_void> *)
                            ((long)(pnVar4->m_backend).data._M_elems + lVar29));
        cVar23 = (char)local_950;
        if (iVar11 != 0) {
          pnVar25 = (this->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00248fdc;
        }
        pcVar26 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)(this->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thekey,iVar10,p_cnames,local_938);
        pnVar25 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29);
        local_6b8 = *puVar17;
        uStack_6b0 = puVar17[1];
        puVar17 = (undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x10);
        local_6a8 = *puVar17;
        uStack_6a0 = puVar17[1];
        local_698 = *(undefined8 *)((long)(pnVar25->m_backend).data._M_elems + lVar29 + 0x20);
        local_690 = *(undefined4 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29);
        local_68c = *(undefined1 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 4U);
        local_688 = *(undefined8 *)((long)(&(pnVar25->m_backend).data + 1) + lVar29 + 8U);
        local_238 = 0xa00000000;
        uStack_248 = 0;
        uStack_243 = 0;
        uStack_258 = 0;
        uStack_250 = 0;
        local_24b = 0;
        local_268 = 0;
        uStack_260 = 0;
        pcVar31 = (cpp_dec_float<50u,int,void> *)&local_268;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(pcVar31,0.0);
        pcVar13 = "FX";
        pcVar27 = (cpp_dec_float<50u,int,void> *)&local_6b8;
LAB_00249793:
        MPSwriteRecord<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (p_output,pcVar13,"BOUND",pcVar26,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar27,(char *)0x0,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pcVar31);
      }
      lVar28 = lVar28 + 1;
      lVar29 = lVar29 + 0x38;
    } while (lVar28 < (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ENDATA",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  if (((this->thesense == MAXIMIZE) && (pSVar6 = this->spxout, pSVar6 != (SPxOut *)0x0)) &&
     (0 < (int)pSVar6->m_verbosity)) {
    local_9e8.data._M_elems[0] = pSVar6->m_verbosity;
    local_998.data._M_elems[0] = 1;
    (*pSVar6->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
               ,99);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_9e8);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}